

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deflate_decompress.c
# Opt level: O0

_Bool build_precode_decode_table(libdeflate_decompressor *d)

{
  _Bool _Var1;
  uint in_stack_000000b0;
  uint in_stack_000000b4;
  u32 *in_stack_000000b8;
  uint in_stack_000000c4;
  u8 *in_stack_000000c8;
  u32 *in_stack_000000d0;
  u16 *in_stack_00000120;
  uint *in_stack_00000128;
  
  _Var1 = build_decode_table(in_stack_000000d0,in_stack_000000c8,in_stack_000000c4,in_stack_000000b8
                             ,in_stack_000000b4,in_stack_000000b0,in_stack_00000120,
                             in_stack_00000128);
  return _Var1;
}

Assistant:

static bool
build_precode_decode_table(struct libdeflate_decompressor *d)
{
	/* When you change TABLEBITS, you must change ENOUGH, and vice versa! */
	STATIC_ASSERT(PRECODE_TABLEBITS == 7 && PRECODE_ENOUGH == 128);

	STATIC_ASSERT(ARRAY_LEN(precode_decode_results) ==
		      DEFLATE_NUM_PRECODE_SYMS);

	return build_decode_table(d->u.l.precode_decode_table,
				  d->u.precode_lens,
				  DEFLATE_NUM_PRECODE_SYMS,
				  precode_decode_results,
				  PRECODE_TABLEBITS,
				  DEFLATE_MAX_PRE_CODEWORD_LEN,
				  d->sorted_syms,
				  NULL);
}